

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

path * __thiscall ghc::filesystem::path::root_directory(path *__return_storage_ptr__,path *this)

{
  char *pcVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  string_type local_30;
  
  uVar4 = (this->_path)._M_string_length;
  if (uVar4 < 3) {
    uVar3 = 0;
  }
  else {
    pcVar1 = (this->_path)._M_dataplus._M_p;
    if (*pcVar1 != '/') goto LAB_00106d5b;
    if (((pcVar1[1] != '/') || (pcVar1[2] == 0x2f)) || (iVar2 = isprint((int)pcVar1[2]), iVar2 == 0)
       ) goto LAB_00106d2f;
    uVar3 = std::__cxx11::string::find((char)this,0x2f);
    uVar4 = (this->_path)._M_string_length;
    if (uVar3 == 0xffffffffffffffff) {
      uVar3 = uVar4;
    }
  }
  if ((uVar3 < uVar4) && ((this->_path)._M_dataplus._M_p[uVar3] == '/')) {
LAB_00106d2f:
    if ((root_directory()::_root_dir == '\0') &&
       (iVar2 = __cxa_guard_acquire(&root_directory()::_root_dir), iVar2 != 0)) {
      local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_30,'\x01');
      path(&root_directory::_root_dir,&local_30,native_format);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      }
      __cxa_atexit(~path,&root_directory::_root_dir,&__dso_handle);
      __cxa_guard_release(&root_directory()::_root_dir);
    }
    (__return_storage_ptr__->_path)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_path).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,root_directory::_root_dir._path._M_dataplus._M_p,
               root_directory::_root_dir._path._M_dataplus._M_p +
               root_directory::_root_dir._path._M_string_length);
    return __return_storage_ptr__;
  }
LAB_00106d5b:
  (__return_storage_ptr__->_path)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->_path).field_2;
  (__return_storage_ptr__->_path)._M_string_length = 0;
  (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path path::root_directory() const
{
    if (has_root_directory()) {
        static const path _root_dir(std::string(1, preferred_separator), native_format);
        return _root_dir;
    }
    return path();
}